

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonMaximumSuppression.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::NonMaximumSuppression::MergeFrom
          (NonMaximumSuppression *this,NonMaximumSuppression *from)

{
  SuppressionMethodCase SVar1;
  ClassLabelsCase CVar2;
  LogMessage *other;
  long lVar3;
  string *psVar4;
  NonMaximumSuppression_PickTop *this_00;
  NonMaximumSuppression_PickTop *from_00;
  StringVector *this_01;
  StringVector *from_01;
  Int64Vector *this_02;
  Int64Vector *from_02;
  InternalMetadataWithArenaLite *this_03;
  double dVar5;
  LogFinisher local_a5;
  uint32 cached_has_bits;
  byte local_91;
  LogMessage local_90;
  NonMaximumSuppression *local_58;
  NonMaximumSuppression *from_local;
  NonMaximumSuppression *this_local;
  InternalMetadataWithArenaLite *local_40;
  InternalMetadataWithArenaLite *local_38;
  InternalMetadataWithArenaLite *local_30;
  InternalMetadataWithArenaLite *local_28;
  Container *local_20;
  InternalMetadataWithArenaLite *local_18;
  InternalMetadataWithArenaLite *local_10;
  
  local_91 = 0;
  local_58 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/build_O0/mlmodel/format/NonMaximumSuppression.pb.cc"
               ,0x353);
    local_91 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_90,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_a5,other);
  }
  if ((local_91 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_90);
  }
  this_03 = &this->_internal_metadata_;
  this_local = (NonMaximumSuppression *)&local_58->_internal_metadata_;
  local_40 = this_03;
  local_38 = (InternalMetadataWithArenaLite *)this_local;
  local_30 = (InternalMetadataWithArenaLite *)this_local;
  if (((uint)(((InternalMetadataWithArenaLite *)this_local)->
             super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ).ptr_ & 1) == 1) {
    local_28 = (InternalMetadataWithArenaLite *)this_local;
    local_18 = (InternalMetadataWithArenaLite *)this_local;
    local_10 = (InternalMetadataWithArenaLite *)this_local;
    if (((uint)(((InternalMetadataWithArenaLite *)this_local)->
               super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
               ).ptr_ & 1) == 1) {
      local_20 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                           ((InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                             *)this_local);
    }
    else {
      local_20 = (Container *)
                 google::protobuf::internal::InternalMetadataWithArenaLite::
                 default_instance_abi_cxx11_();
    }
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (this_03,&local_20->unknown_fields);
  }
  confidenceinputfeaturename_abi_cxx11_(local_58);
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 0) {
    psVar4 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->confidenceinputfeaturename_,psVar4,
               (local_58->confidenceinputfeaturename_).ptr_);
  }
  coordinatesinputfeaturename_abi_cxx11_(local_58);
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 0) {
    psVar4 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->coordinatesinputfeaturename_,psVar4,
               (local_58->coordinatesinputfeaturename_).ptr_);
  }
  iouthresholdinputfeaturename_abi_cxx11_(local_58);
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 0) {
    psVar4 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->iouthresholdinputfeaturename_,psVar4,
               (local_58->iouthresholdinputfeaturename_).ptr_);
  }
  confidencethresholdinputfeaturename_abi_cxx11_(local_58);
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 0) {
    psVar4 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->confidencethresholdinputfeaturename_,psVar4,
               (local_58->confidencethresholdinputfeaturename_).ptr_);
  }
  confidenceoutputfeaturename_abi_cxx11_(local_58);
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 0) {
    psVar4 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->confidenceoutputfeaturename_,psVar4,
               (local_58->confidenceoutputfeaturename_).ptr_);
  }
  coordinatesoutputfeaturename_abi_cxx11_(local_58);
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 0) {
    psVar4 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->coordinatesoutputfeaturename_,psVar4,
               (local_58->coordinatesoutputfeaturename_).ptr_);
  }
  dVar5 = iouthreshold(local_58);
  if ((dVar5 != 0.0) || (NAN(dVar5))) {
    dVar5 = iouthreshold(local_58);
    set_iouthreshold(this,dVar5);
  }
  dVar5 = confidencethreshold(local_58);
  if ((dVar5 != 0.0) || (NAN(dVar5))) {
    dVar5 = confidencethreshold(local_58);
    set_confidencethreshold(this,dVar5);
  }
  SVar1 = SuppressionMethod_case(local_58);
  if ((SVar1 != SUPPRESSIONMETHOD_NOT_SET) && (SVar1 == kPickTop)) {
    this_00 = mutable_picktop(this);
    from_00 = picktop(local_58);
    NonMaximumSuppression_PickTop::MergeFrom(this_00,from_00);
  }
  CVar2 = ClassLabels_case(local_58);
  if (CVar2 != CLASSLABELS_NOT_SET) {
    if (CVar2 == kStringClassLabels) {
      this_01 = mutable_stringclasslabels(this);
      from_01 = stringclasslabels(local_58);
      StringVector::MergeFrom(this_01,from_01);
    }
    else if (CVar2 == kInt64ClassLabels) {
      this_02 = mutable_int64classlabels(this);
      from_02 = int64classlabels(local_58);
      Int64Vector::MergeFrom(this_02,from_02);
    }
  }
  return;
}

Assistant:

void NonMaximumSuppression::MergeFrom(const NonMaximumSuppression& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.NonMaximumSuppression)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.confidenceinputfeaturename().size() > 0) {

    confidenceinputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.confidenceinputfeaturename_);
  }
  if (from.coordinatesinputfeaturename().size() > 0) {

    coordinatesinputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.coordinatesinputfeaturename_);
  }
  if (from.iouthresholdinputfeaturename().size() > 0) {

    iouthresholdinputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.iouthresholdinputfeaturename_);
  }
  if (from.confidencethresholdinputfeaturename().size() > 0) {

    confidencethresholdinputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.confidencethresholdinputfeaturename_);
  }
  if (from.confidenceoutputfeaturename().size() > 0) {

    confidenceoutputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.confidenceoutputfeaturename_);
  }
  if (from.coordinatesoutputfeaturename().size() > 0) {

    coordinatesoutputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.coordinatesoutputfeaturename_);
  }
  if (from.iouthreshold() != 0) {
    set_iouthreshold(from.iouthreshold());
  }
  if (from.confidencethreshold() != 0) {
    set_confidencethreshold(from.confidencethreshold());
  }
  switch (from.SuppressionMethod_case()) {
    case kPickTop: {
      mutable_picktop()->::CoreML::Specification::NonMaximumSuppression_PickTop::MergeFrom(from.picktop());
      break;
    }
    case SUPPRESSIONMETHOD_NOT_SET: {
      break;
    }
  }
  switch (from.ClassLabels_case()) {
    case kStringClassLabels: {
      mutable_stringclasslabels()->::CoreML::Specification::StringVector::MergeFrom(from.stringclasslabels());
      break;
    }
    case kInt64ClassLabels: {
      mutable_int64classlabels()->::CoreML::Specification::Int64Vector::MergeFrom(from.int64classlabels());
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
}